

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O2

void __thiscall
HookStateStepOut::ProcessHook
          (HookStateStepOut *this,shared_ptr<Debugger> *debugger,lua_State *L,lua_Debug *ar)

{
  __shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>);
  StackLevelBasedState::UpdateStackLevel
            (&this->super_StackLevelBasedState,(shared_ptr<Debugger> *)&local_40,L,ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  if ((this->super_StackLevelBasedState).newStackLevel <
      (this->super_StackLevelBasedState).oriStackLevel) {
    Debugger::HandleBreak
              ((debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  else {
    std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return;
}

Assistant:

void HookStateStepOut::ProcessHook(std::shared_ptr<Debugger> debugger, lua_State* L, lua_Debug* ar)
{
	UpdateStackLevel(debugger, L, ar);
	if (newStackLevel < oriStackLevel)
	{
		debugger->HandleBreak();
		return;
	}
	StackLevelBasedState::ProcessHook(debugger, L, ar);
}